

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall
QSynth::setSynthProfile(QSynth *this,SynthProfile *synthProfile,QString *useSynthProfileName)

{
  int iVar1;
  int iVar2;
  
  QString::operator=(&this->synthProfileName,useSynthProfileName);
  QDir::operator=(&this->romDir,&synthProfile->romDir);
  QString::operator=(&this->controlROMFileName,&synthProfile->controlROMFileName);
  QString::operator=(&this->controlROMFileName2,&synthProfile->controlROMFileName2);
  QString::operator=(&this->pcmROMFileName,&synthProfile->pcmROMFileName);
  QString::operator=(&this->pcmROMFileName2,&synthProfile->pcmROMFileName2);
  this->analogOutputMode = synthProfile->analogOutputMode;
  setRendererType(this,synthProfile->rendererType);
  iVar2 = 0x100;
  if (synthProfile->partialCount < 0x100) {
    iVar2 = synthProfile->partialCount;
  }
  iVar1 = 8;
  if (8 < iVar2) {
    iVar1 = iVar2;
  }
  this->partialCount = iVar1;
  setReverbCompatibilityMode(this,synthProfile->reverbCompatibilityMode);
  setMIDIDelayMode(this,synthProfile->midiDelayMode);
  setDACInputMode(this,synthProfile->emuDACInputMode);
  setOutputGain(this,synthProfile->outputGain);
  setReverbOutputGain(this,synthProfile->reverbOutputGain);
  setReverbOverridden(this,synthProfile->reverbOverridden);
  if (synthProfile->reverbOverridden == true) {
    setReverbSettings(this,synthProfile->reverbMode,synthProfile->reverbTime,
                      synthProfile->reverbLevel);
    setReverbEnabled(this,synthProfile->reverbEnabled);
  }
  setReversedStereoEnabled(this,synthProfile->reversedStereoEnabled);
  setNiceAmpRampEnabled(this,synthProfile->niceAmpRamp);
  setNicePanningEnabled(this,synthProfile->nicePanning);
  setNicePartialMixingEnabled(this,synthProfile->nicePartialMixing);
  this->engageChannel1OnOpen = synthProfile->engageChannel1OnOpen;
  setDisplayCompatibilityMode(this,synthProfile->displayCompatibilityMode);
  return;
}

Assistant:

void QSynth::setSynthProfile(const SynthProfile &synthProfile, QString useSynthProfileName) {
	synthProfileName = useSynthProfileName;

	// Settings below do not take effect before re-open.
	romDir = synthProfile.romDir;
	controlROMFileName = synthProfile.controlROMFileName;
	controlROMFileName2 = synthProfile.controlROMFileName2;
	pcmROMFileName = synthProfile.pcmROMFileName;
	pcmROMFileName2 = synthProfile.pcmROMFileName2;
	setAnalogOutputMode(synthProfile.analogOutputMode);
	setRendererType(synthProfile.rendererType);
	setPartialCount(synthProfile.partialCount);

	// Settings below take effect immediately.
	setReverbCompatibilityMode(synthProfile.reverbCompatibilityMode);
	setMIDIDelayMode(synthProfile.midiDelayMode);
	setDACInputMode(synthProfile.emuDACInputMode);
	setOutputGain(synthProfile.outputGain);
	setReverbOutputGain(synthProfile.reverbOutputGain);
	setReverbOverridden(synthProfile.reverbOverridden);
	if (synthProfile.reverbOverridden) {
		setReverbSettings(synthProfile.reverbMode, synthProfile.reverbTime, synthProfile.reverbLevel);
		setReverbEnabled(synthProfile.reverbEnabled);
	}
	setReversedStereoEnabled(synthProfile.reversedStereoEnabled);
	setNiceAmpRampEnabled(synthProfile.niceAmpRamp);
	setNicePanningEnabled(synthProfile.nicePanning);
	setNicePartialMixingEnabled(synthProfile.nicePartialMixing);
	setInitialMIDIChannelsAssignment(synthProfile.engageChannel1OnOpen);
	setDisplayCompatibilityMode(synthProfile.displayCompatibilityMode);
}